

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNShaperTest.cpp
# Opt level: O3

int testSamePaddingConvolution(void)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  ModelDescription *pMVar4;
  Type *pTVar5;
  FeatureType *pFVar6;
  Type *pTVar7;
  ArrayFeatureType_EnumeratedShapes *pAVar8;
  ArrayFeatureType *pAVar9;
  TypeUnion this;
  Type *this_00;
  LayerUnion this_01;
  SamePadding *this_02;
  WeightParams *pWVar10;
  ShapeConstraint *pSVar11;
  ShapeRange *pSVar12;
  size_t sVar13;
  ostream *poVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  RangeValue RVar18;
  Model m1;
  NeuralNetworkShaper shapes;
  string local_e0;
  Model local_c0;
  undefined1 local_90 [56];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
  local_58;
  
  CoreML::Specification::Model::Model(&local_c0);
  if (local_c0.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_c0.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_c0.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar1 = local_90 + 0x10;
  local_90._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_90);
  if ((pointer)local_90._0_8_ != pcVar1) {
    operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6 == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    pAVar9 = (pFVar6->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar9 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar9);
    (pFVar6->Type_).multiarraytype_ = pAVar9;
  }
  if (pAVar9->_oneof_case_[0] == 0x1f) {
    pAVar8 = (pAVar9->ShapeFlexibility_).enumeratedshapes_;
  }
  else {
    CoreML::Specification::ArrayFeatureType::clear_ShapeFlexibility(pAVar9);
    pAVar9->_oneof_case_[0] = 0x1f;
    pAVar8 = (ArrayFeatureType_EnumeratedShapes *)operator_new(0x30);
    CoreML::Specification::ArrayFeatureType_ShapeRange::ArrayFeatureType_ShapeRange
              ((ArrayFeatureType_ShapeRange *)pAVar8);
    (pAVar9->ShapeFlexibility_).shaperange_ = (ArrayFeatureType_ShapeRange *)pAVar8;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                     ((RepeatedPtrFieldBase *)&pAVar8->shapes_,(Type *)0x0);
  pTVar7->lowerbound_ = 4;
  pTVar7->upperbound_ = 4;
  if (pAVar9->_oneof_case_[0] == 0x1f) {
    pAVar8 = (pAVar9->ShapeFlexibility_).enumeratedshapes_;
  }
  else {
    CoreML::Specification::ArrayFeatureType::clear_ShapeFlexibility(pAVar9);
    pAVar9->_oneof_case_[0] = 0x1f;
    pAVar8 = (ArrayFeatureType_EnumeratedShapes *)operator_new(0x30);
    CoreML::Specification::ArrayFeatureType_ShapeRange::ArrayFeatureType_ShapeRange
              ((ArrayFeatureType_ShapeRange *)pAVar8);
    (pAVar9->ShapeFlexibility_).shaperange_ = (ArrayFeatureType_ShapeRange *)pAVar8;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                     ((RepeatedPtrFieldBase *)&pAVar8->shapes_,(Type *)0x0);
  pTVar7->lowerbound_ = 100;
  pTVar7->upperbound_ = 100;
  if (pAVar9->_oneof_case_[0] == 0x1f) {
    pAVar8 = (pAVar9->ShapeFlexibility_).enumeratedshapes_;
  }
  else {
    CoreML::Specification::ArrayFeatureType::clear_ShapeFlexibility(pAVar9);
    pAVar9->_oneof_case_[0] = 0x1f;
    pAVar8 = (ArrayFeatureType_EnumeratedShapes *)operator_new(0x30);
    CoreML::Specification::ArrayFeatureType_ShapeRange::ArrayFeatureType_ShapeRange
              ((ArrayFeatureType_ShapeRange *)pAVar8);
    (pAVar9->ShapeFlexibility_).shaperange_ = (ArrayFeatureType_ShapeRange *)pAVar8;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                     ((RepeatedPtrFieldBase *)&pAVar8->shapes_,(Type *)0x0);
  pTVar7->lowerbound_ = 100;
  pTVar7->upperbound_ = 200;
  if (local_c0.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_c0.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_c0.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_90._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"output","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_90);
  if ((pointer)local_90._0_8_ != pcVar1) {
    operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6 == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar9 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar9);
    (pFVar6->Type_).multiarraytype_ = pAVar9;
  }
  if (local_c0._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_c0);
    local_c0._oneof_case_[0] = 500;
    this.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this.neuralnetwork_);
    local_c0.Type_.pipelineclassifier_ = this.pipelineclassifier_;
  }
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_c0.Type_.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"output");
  if (this_00->_oneof_case_[0] == 100) {
    this_01 = this_00->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
    this_00->_oneof_case_[0] = 100;
    this_01.convolution_ = (ConvolutionLayerParams *)operator_new(0xb0);
    CoreML::Specification::ConvolutionLayerParams::ConvolutionLayerParams(this_01.convolution_);
    (this_00->layer_).convolution_ = (ConvolutionLayerParams *)this_01;
  }
  (this_01.convolution_)->outputchannels_ = 5;
  (this_01.convolution_)->kernelchannels_ = 4;
  iVar17 = ((this_01.convolution_)->kernelsize_).current_size_;
  iVar15 = ((this_01.convolution_)->kernelsize_).total_size_;
  if (iVar17 == iVar15) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve
              (&(this_01.convolution_)->kernelsize_,iVar17 + 1);
    iVar17 = ((this_01.convolution_)->kernelsize_).current_size_;
    iVar15 = ((this_01.convolution_)->kernelsize_).total_size_;
  }
  pWVar10 = (this_01.innerproduct_)->bias_;
  iVar16 = iVar17 + 1;
  ((this_01.convolution_)->kernelsize_).current_size_ = iVar16;
  (&pWVar10->_internal_metadata_)[iVar17].
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x7;
  if (iVar16 == iVar15) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve
              (&(this_01.convolution_)->kernelsize_,iVar17 + 2);
    iVar16 = ((this_01.convolution_)->kernelsize_).current_size_;
    pWVar10 = (this_01.innerproduct_)->bias_;
  }
  ((this_01.convolution_)->kernelsize_).current_size_ = iVar16 + 1;
  (&pWVar10->_internal_metadata_)[iVar16].
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x8;
  if ((this_01.convolution_)->_oneof_case_[0] != 0x33) {
    CoreML::Specification::ConvolutionLayerParams::clear_ConvolutionPaddingType
              (this_01.convolution_);
    (this_01.convolution_)->_oneof_case_[0] = 0x33;
    this_02 = (SamePadding *)operator_new(0x18);
    CoreML::Specification::SamePadding::SamePadding(this_02);
    ((this_01.convolution_)->ConvolutionPaddingType_).same_ = this_02;
  }
  (this_01.convolution_)->hasbias_ = false;
  iVar17 = 0x460;
  do {
    pWVar10 = (this_01.convolution_)->weights_;
    if (pWVar10 == (WeightParams *)0x0) {
      pWVar10 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(pWVar10);
      (this_01.convolution_)->weights_ = pWVar10;
    }
    iVar15 = (pWVar10->floatvalue_).current_size_;
    if (iVar15 == (pWVar10->floatvalue_).total_size_) {
      google::protobuf::RepeatedField<float>::Reserve(&pWVar10->floatvalue_,iVar15 + 1);
      iVar15 = (pWVar10->floatvalue_).current_size_;
    }
    (pWVar10->floatvalue_).current_size_ = iVar15 + 1;
    ((pWVar10->floatvalue_).rep_)->elements[iVar15] = 1.0;
    iVar17 = iVar17 + -1;
  } while (iVar17 != 0);
  CoreML::NeuralNetworkShaper::NeuralNetworkShaper((NeuralNetworkShaper *)local_90,&local_c0,true);
  paVar2 = &local_e0.field_2;
  local_e0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"input","");
  pSVar11 = CoreML::NeuralNetworkShaper::shape((NeuralNetworkShaper *)local_90,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  pSVar12 = CoreML::ShapeConstraint::sequenceRange(pSVar11);
  sVar13 = CoreML::ShapeRange::minimumValue(pSVar12);
  if (sVar13 == 0) {
    pSVar12 = CoreML::ShapeConstraint::sequenceRange(pSVar11);
    RVar18 = CoreML::ShapeRange::maximumValue(pSVar12);
    local_e0._M_string_length = RVar18._val;
    local_e0._M_dataplus._M_p._0_1_ = RVar18._isUnbound;
    bVar3 = CoreML::RangeValue::isUnbound((RangeValue *)&local_e0);
    if (bVar3) {
      pSVar12 = CoreML::ShapeConstraint::batchRange(pSVar11);
      sVar13 = CoreML::ShapeRange::minimumValue(pSVar12);
      if (sVar13 == 0) {
        pSVar12 = CoreML::ShapeConstraint::batchRange(pSVar11);
        RVar18 = CoreML::ShapeRange::maximumValue(pSVar12);
        local_e0._M_string_length = RVar18._val;
        local_e0._M_dataplus._M_p._0_1_ = RVar18._isUnbound;
        bVar3 = CoreML::RangeValue::isUnbound((RangeValue *)&local_e0);
        if (bVar3) {
          pSVar12 = CoreML::ShapeConstraint::channelRange(pSVar11);
          sVar13 = CoreML::ShapeRange::minimumValue(pSVar12);
          if (sVar13 == 4) {
            pSVar12 = CoreML::ShapeConstraint::channelRange(pSVar11);
            RVar18 = CoreML::ShapeRange::maximumValue(pSVar12);
            local_e0._M_string_length = RVar18._val;
            local_e0._M_dataplus._M_p._0_1_ = RVar18._isUnbound;
            sVar13 = CoreML::RangeValue::value((RangeValue *)&local_e0);
            if (sVar13 == 4) {
              pSVar12 = CoreML::ShapeConstraint::heightRange(pSVar11);
              sVar13 = CoreML::ShapeRange::minimumValue(pSVar12);
              if (sVar13 == 100) {
                pSVar12 = CoreML::ShapeConstraint::heightRange(pSVar11);
                RVar18 = CoreML::ShapeRange::maximumValue(pSVar12);
                local_e0._M_string_length = RVar18._val;
                local_e0._M_dataplus._M_p._0_1_ = RVar18._isUnbound;
                sVar13 = CoreML::RangeValue::value((RangeValue *)&local_e0);
                if (sVar13 == 100) {
                  pSVar12 = CoreML::ShapeConstraint::widthRange(pSVar11);
                  sVar13 = CoreML::ShapeRange::minimumValue(pSVar12);
                  if (sVar13 == 100) {
                    pSVar12 = CoreML::ShapeConstraint::widthRange(pSVar11);
                    RVar18 = CoreML::ShapeRange::maximumValue(pSVar12);
                    local_e0._M_string_length = RVar18._val;
                    local_e0._M_dataplus._M_p._0_1_ = RVar18._isUnbound;
                    sVar13 = CoreML::RangeValue::value((RangeValue *)&local_e0);
                    if (sVar13 == 200) {
                      local_e0._M_dataplus._M_p = (pointer)paVar2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_e0,"output","");
                      pSVar11 = CoreML::NeuralNetworkShaper::shape
                                          ((NeuralNetworkShaper *)local_90,&local_e0);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_e0._M_dataplus._M_p != paVar2) {
                        operator_delete(local_e0._M_dataplus._M_p,
                                        local_e0.field_2._M_allocated_capacity + 1);
                      }
                      pSVar12 = CoreML::ShapeConstraint::sequenceRange(pSVar11);
                      sVar13 = CoreML::ShapeRange::minimumValue(pSVar12);
                      if (sVar13 == 0) {
                        pSVar12 = CoreML::ShapeConstraint::sequenceRange(pSVar11);
                        RVar18 = CoreML::ShapeRange::maximumValue(pSVar12);
                        local_e0._M_string_length = RVar18._val;
                        local_e0._M_dataplus._M_p._0_1_ = RVar18._isUnbound;
                        bVar3 = CoreML::RangeValue::isUnbound((RangeValue *)&local_e0);
                        if (bVar3) {
                          pSVar12 = CoreML::ShapeConstraint::batchRange(pSVar11);
                          sVar13 = CoreML::ShapeRange::minimumValue(pSVar12);
                          if (sVar13 == 0) {
                            pSVar12 = CoreML::ShapeConstraint::batchRange(pSVar11);
                            RVar18 = CoreML::ShapeRange::maximumValue(pSVar12);
                            local_e0._M_string_length = RVar18._val;
                            local_e0._M_dataplus._M_p._0_1_ = RVar18._isUnbound;
                            bVar3 = CoreML::RangeValue::isUnbound((RangeValue *)&local_e0);
                            if (bVar3) {
                              pSVar12 = CoreML::ShapeConstraint::channelRange(pSVar11);
                              sVar13 = CoreML::ShapeRange::minimumValue(pSVar12);
                              if (sVar13 == 5) {
                                pSVar12 = CoreML::ShapeConstraint::channelRange(pSVar11);
                                RVar18 = CoreML::ShapeRange::maximumValue(pSVar12);
                                local_e0._M_string_length = RVar18._val;
                                local_e0._M_dataplus._M_p._0_1_ = RVar18._isUnbound;
                                sVar13 = CoreML::RangeValue::value((RangeValue *)&local_e0);
                                if (sVar13 == 5) {
                                  pSVar12 = CoreML::ShapeConstraint::heightRange(pSVar11);
                                  sVar13 = CoreML::ShapeRange::minimumValue(pSVar12);
                                  if (sVar13 == 100) {
                                    pSVar12 = CoreML::ShapeConstraint::heightRange(pSVar11);
                                    RVar18 = CoreML::ShapeRange::maximumValue(pSVar12);
                                    local_e0._M_string_length = RVar18._val;
                                    local_e0._M_dataplus._M_p._0_1_ = RVar18._isUnbound;
                                    sVar13 = CoreML::RangeValue::value((RangeValue *)&local_e0);
                                    if (sVar13 == 100) {
                                      pSVar12 = CoreML::ShapeConstraint::widthRange(pSVar11);
                                      sVar13 = CoreML::ShapeRange::minimumValue(pSVar12);
                                      if (sVar13 == 100) {
                                        pSVar12 = CoreML::ShapeConstraint::widthRange(pSVar11);
                                        RVar18 = CoreML::ShapeRange::maximumValue(pSVar12);
                                        local_e0._M_string_length = RVar18._val;
                                        local_e0._M_dataplus._M_p._0_1_ = RVar18._isUnbound;
                                        sVar13 = CoreML::RangeValue::value((RangeValue *)&local_e0);
                                        iVar17 = 0;
                                        if (sVar13 == 200) goto LAB_00150012;
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&std::cout,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                                  ,0x68);
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&std::cout,":",1);
                                        poVar14 = (ostream *)
                                                  std::ostream::operator<<
                                                            ((ostream *)&std::cout,0x198);
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  (poVar14,": error: ",9);
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  (poVar14,
                                                  "outShape.widthRange().maximumValue().value() == 200"
                                                  ,0x33);
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  (poVar14," was false, expected true.",0x1a);
                                      }
                                      else {
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&std::cout,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                                  ,0x68);
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&std::cout,":",1);
                                        poVar14 = (ostream *)
                                                  std::ostream::operator<<
                                                            ((ostream *)&std::cout,0x197);
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  (poVar14,": error: ",9);
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  (poVar14,
                                                  "outShape.widthRange().minimumValue() == 100",0x2b
                                                  );
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  (poVar14," was false, expected true.",0x1a);
                                      }
                                    }
                                    else {
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)&std::cout,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                                 ,0x68);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)&std::cout,":",1);
                                      poVar14 = (ostream *)
                                                std::ostream::operator<<
                                                          ((ostream *)&std::cout,0x195);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar14,": error: ",9);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar14,
                                                 "outShape.heightRange().maximumValue().value() == 100"
                                                 ,0x34);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar14," was false, expected true.",0x1a);
                                    }
                                  }
                                  else {
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&std::cout,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                               ,0x68);
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&std::cout,":",1);
                                    poVar14 = (ostream *)
                                              std::ostream::operator<<((ostream *)&std::cout,0x194);
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar14,": error: ",9);
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar14,
                                               "outShape.heightRange().minimumValue() == 100",0x2c);
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar14," was false, expected true.",0x1a);
                                  }
                                }
                                else {
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cout,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                             ,0x68);
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cout,":",1);
                                  poVar14 = (ostream *)
                                            std::ostream::operator<<((ostream *)&std::cout,0x192);
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar14,": error: ",9);
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar14,
                                             "outShape.channelRange().maximumValue().value() == 5",
                                             0x33);
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar14," was false, expected true.",0x1a);
                                }
                              }
                              else {
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                           ,0x68);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,":",1);
                                poVar14 = (ostream *)
                                          std::ostream::operator<<((ostream *)&std::cout,0x191);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar14,": error: ",9);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar14,"outShape.channelRange().minimumValue() == 5",
                                           0x2b);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar14," was false, expected true.",0x1a);
                              }
                            }
                            else {
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                         ,0x68);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,":",1);
                              poVar14 = (ostream *)
                                        std::ostream::operator<<((ostream *)&std::cout,399);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar14,": error: ",9);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar14,"outShape.batchRange().maximumValue().isUnbound()",
                                         0x30);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar14," was false, expected true.",0x1a);
                            }
                          }
                          else {
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                       ,0x68);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,":",1);
                            poVar14 = (ostream *)
                                      std::ostream::operator<<((ostream *)&std::cout,0x18e);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar14,": error: ",9);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar14,"outShape.batchRange().minimumValue() == 0",0x29);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar14," was false, expected true.",0x1a);
                          }
                        }
                        else {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                     ,0x68);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,":",1);
                          poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x18c)
                          ;
                          std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar14,"outShape.sequenceRange().maximumValue().isUnbound()",
                                     0x33);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar14," was false, expected true.",0x1a);
                        }
                      }
                      else {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                   ,0x68);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,":",1);
                        poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x18b);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar14,"outShape.sequenceRange().minimumValue() == 0",0x2c);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar14," was false, expected true.",0x1a);
                      }
                      iVar17 = 1;
                      std::endl<char,std::char_traits<char>>(poVar14);
                      goto LAB_00150012;
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                               ,0x68);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                    poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x188);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar14,"inShape.widthRange().maximumValue().value() == 200",0x32);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar14," was false, expected true.",0x1a);
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                               ,0x68);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                    poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x187);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar14,"inShape.widthRange().minimumValue() == 100",0x2a);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar14," was false, expected true.",0x1a);
                  }
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                             ,0x68);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                  poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x185);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar14,"inShape.heightRange().maximumValue().value() == 100",0x33);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar14," was false, expected true.",0x1a);
                }
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                           ,0x68);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x184);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,"inShape.heightRange().minimumValue() == 100",0x2b);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14," was false, expected true.",0x1a);
              }
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                         ,0x68);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
              poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x182);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar14,"inShape.channelRange().maximumValue().value() == 4",0x32);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar14," was false, expected true.",0x1a);
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                       ,0x68);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
            poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x181);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,"inShape.channelRange().minimumValue() == 4",0x2a);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14," was false, expected true.",0x1a);
          }
          iVar17 = 1;
          std::endl<char,std::char_traits<char>>(poVar14);
          goto LAB_00150012;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                   ,0x68);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x17f);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14,"inShape.batchRange().maximumValue().isUnbound()",0x2f);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14," was false, expected true.",0x1a);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                   ,0x68);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x17e);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14,"inShape.batchRange().minimumValue() == 0",0x28);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14," was false, expected true.",0x1a);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                 ,0x68);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x17c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar14,"inShape.sequenceRange().maximumValue().isUnbound()",0x32);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x17b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,"inShape.sequenceRange().minimumValue() == 0",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
  }
  std::ostream::put((char)poVar14);
  iVar17 = 1;
  std::ostream::flush();
LAB_00150012:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
  ::~_Rb_tree(&local_58);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
               *)(local_90 + 8));
  CoreML::Specification::Model::~Model(&local_c0);
  return iVar17;
}

Assistant:

int testSamePaddingConvolution() {
    
    Specification::Model m1;
    
    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    auto *shape1 = shape->mutable_shaperange()->add_sizeranges();
    shape1->set_lowerbound(4);
    shape1->set_upperbound(4);
    auto *shape2 = shape->mutable_shaperange()->add_sizeranges();
    shape2->set_lowerbound(100);
    shape2->set_upperbound(100);
    auto *shape3 = shape->mutable_shaperange()->add_sizeranges();
    shape3->set_lowerbound(100);
    shape3->set_upperbound(200);
    
    auto *out = m1.mutable_description()->add_output();
    out->set_name("output");
    out->mutable_type()->mutable_multiarraytype();
    
    auto *nn = m1.mutable_neuralnetwork();
    
    Specification::NeuralNetworkLayer *convLayer = nn->add_layers();
    convLayer->add_input("input");
    convLayer->add_output("output");
    Specification::ConvolutionLayerParams *convParams = convLayer->mutable_convolution();
    convParams->set_outputchannels(5);
    convParams->set_kernelchannels(4);
    convParams->add_kernelsize(7);
    convParams->add_kernelsize(8);
    convParams->mutable_same();
    convParams->set_hasbias(false);
    for (int i = 0; i < 5*4*7*8; i++) {
        convParams->mutable_weights()->add_floatvalue(1.0);
    }
    
    NeuralNetworkShaper shapes(m1);
    
    const ShapeConstraint &inShape = shapes.shape("input");
    ML_ASSERT(inShape.sequenceRange().minimumValue() == 0);
    ML_ASSERT(inShape.sequenceRange().maximumValue().isUnbound());
    
    ML_ASSERT(inShape.batchRange().minimumValue() == 0);
    ML_ASSERT(inShape.batchRange().maximumValue().isUnbound());
    
    ML_ASSERT(inShape.channelRange().minimumValue() == 4);
    ML_ASSERT(inShape.channelRange().maximumValue().value() == 4);
    
    ML_ASSERT(inShape.heightRange().minimumValue() == 100);
    ML_ASSERT(inShape.heightRange().maximumValue().value() == 100);
    
    ML_ASSERT(inShape.widthRange().minimumValue() == 100);
    ML_ASSERT(inShape.widthRange().maximumValue().value() == 200);
    
    const ShapeConstraint &outShape = shapes.shape("output");
    ML_ASSERT(outShape.sequenceRange().minimumValue() == 0);
    ML_ASSERT(outShape.sequenceRange().maximumValue().isUnbound());
    
    ML_ASSERT(outShape.batchRange().minimumValue() == 0);
    ML_ASSERT(outShape.batchRange().maximumValue().isUnbound());
    
    ML_ASSERT(outShape.channelRange().minimumValue() == 5);
    ML_ASSERT(outShape.channelRange().maximumValue().value() == 5);
    
    ML_ASSERT(outShape.heightRange().minimumValue() == 100);
    ML_ASSERT(outShape.heightRange().maximumValue().value() == 100);
    
    ML_ASSERT(outShape.widthRange().minimumValue() == 100);
    ML_ASSERT(outShape.widthRange().maximumValue().value() == 200);


    return 0;
    
}